

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::isNameAndEquals(QPDFObjectHandle *this,string *name)

{
  bool bVar1;
  __type_conflict1 _Var2;
  string sStack_38;
  
  bVar1 = isName(this);
  if (bVar1) {
    getName_abi_cxx11_(&sStack_38,this);
    _Var2 = std::operator==(&sStack_38,name);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool
QPDFObjectHandle::isNameAndEquals(std::string const& name) const
{
    return isName() && (getName() == name);
}